

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.h
# Opt level: O2

void __thiscall adios2::query::Worker::Worker(Worker *this,Worker *other)

{
  undefined8 uVar1;
  
  *(code **)this = adios2::core::Variable<unsigned_long>::Max;
  *(Worker **)(this + 8) = this + 0x18;
  *(undefined8 *)(this + 0x10) = 0;
  this[0x18] = (Worker)0x0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  std::__cxx11::string::_M_assign((string *)(this + 8));
  uVar1 = *(undefined8 *)(other + 0x30);
  *(undefined8 *)(this + 0x28) = *(undefined8 *)(other + 0x28);
  *(undefined8 *)(this + 0x30) = uVar1;
  *(undefined8 *)(other + 0x30) = 0;
  return;
}

Assistant:

Worker(Worker &&other)
    {
        this->m_QueryFile = other.m_QueryFile;
        this->m_SourceReader = other.m_SourceReader;
        this->m_Query = other.m_Query;
        other.m_Query = nullptr;
    }